

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::read_ktx(mipmapped_texture *this,data_stream_serializer *serializer)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint32 uVar5;
  pixel_format pVar6;
  component_flags cVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  mip_level *pmVar11;
  vector<crnlib::mip_level_*> *this_00;
  mip_level **ppmVar12;
  uchar *__src;
  long in_RDI;
  color_quad_u8 c;
  uint x;
  uint y;
  color_quad_u8 q;
  uint8 *pSrc;
  image_u8 *pImage;
  dxt_image *pDXTImage;
  uint level_pitch;
  uint num_blocks_y;
  uint num_blocks_x;
  uint bytes_per_block;
  vector<unsigned_char> *image_data;
  mip_level *pMip;
  uint height;
  uint width;
  uint level_index;
  uint face_index;
  bool dxt1_alpha;
  orientation_flags_t orient_flags;
  dynamic_string orient;
  bool y_flipped;
  bool x_flipped;
  uint type_bits;
  uint type_size;
  pixel_packer unpacker;
  dxt_format dxt_fmt;
  bool is_compressed_texture;
  int i;
  dynamic_string crnlib_fourcc_str;
  uint32 crnlib_fourcc;
  uint num_faces;
  uint num_mip_levels;
  ktx_texture kt;
  uint in_stack_fffffffffffffd48;
  uint in_stack_fffffffffffffd4c;
  ktx_texture *in_stack_fffffffffffffd50;
  ktx_texture *in_stack_fffffffffffffd58;
  ktx_texture *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  element *in_stack_fffffffffffffd88;
  element_vec *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  dxt_image *in_stack_fffffffffffffda0;
  color_quad<unsigned_char,_int> local_180;
  uint local_17c;
  uint local_178;
  ktx_texture *local_170;
  ktx_texture *local_168;
  dxt_image *local_160;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  vector<unsigned_char> *local_148;
  mip_level *local_140;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  ktx_texture *in_stack_fffffffffffffee0;
  pixel_packer local_100;
  dxt_format local_c4;
  byte local_bd;
  int local_bc;
  dynamic_string local_b8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  undefined4 local_98;
  ktx_texture local_88;
  byte local_1;
  
  clear((mipmapped_texture *)in_stack_fffffffffffffd50);
  set_last_error((mipmapped_texture *)in_stack_fffffffffffffd50,
                 (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  ktx_texture::ktx_texture
            ((ktx_texture *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  bVar1 = ktx_texture::read_from_stream
                    (in_stack_fffffffffffffee0,
                     (data_stream_serializer *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (!bVar1) {
    local_1 = 0;
    local_98 = 1;
    goto LAB_0016cc87;
  }
  uVar3 = ktx_texture::get_depth(&local_88);
  if ((1 < uVar3) || (uVar3 = ktx_texture::get_array_size(&local_88), 1 < uVar3)) {
    set_last_error((mipmapped_texture *)in_stack_fffffffffffffd50,
                   (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    local_1 = 0;
    local_98 = 1;
    goto LAB_0016cc87;
  }
  uVar3 = ktx_texture::get_width(&local_88);
  *(uint *)(in_RDI + 0x10) = uVar3;
  uVar3 = ktx_texture::get_height(&local_88);
  *(uint *)(in_RDI + 0x14) = uVar3;
  local_9c = ktx_texture::get_num_mips(&local_88);
  local_a0 = ktx_texture::get_num_faces(&local_88);
  local_a4 = 0;
  dynamic_string::dynamic_string(&local_b8);
  bVar1 = ktx_texture::get_key_value_as_string
                    ((ktx_texture *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     (char *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     (dynamic_string *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68)
                    );
  if ((bVar1) && (uVar3 = dynamic_string::get_len(&local_b8), uVar3 == 4)) {
    for (local_bc = 3; -1 < local_bc; local_bc = local_bc + -1) {
      uVar4 = local_a4 << 8;
      cVar2 = dynamic_string::operator[]
                        ((dynamic_string *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
      local_a4 = uVar4 | (int)cVar2;
    }
  }
  local_bd = ktx_texture::is_compressed(&local_88);
  local_c4 = cDXTInvalid;
  pixel_packer::pixel_packer((pixel_packer *)0x16b76b);
  if ((local_bd & 1) == 0) {
    *(undefined4 *)(in_RDI + 0x1c) = 0x41424752;
    uVar5 = ktx_texture::get_ogl_type(&local_88);
    get_ogl_type_size(uVar5);
    uVar5 = ktx_texture::get_ogl_type(&local_88);
    bVar1 = is_packed_pixel_ogl_type(uVar5);
    if (bVar1) {
      uVar5 = ktx_texture::get_ogl_type(&local_88);
      if (uVar5 == 0x8032) {
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"B2G3R3");
        *(undefined4 *)(in_RDI + 0x1c) = 0x78424752;
      }
      else if (uVar5 == 0x8033) {
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"A4B4G4R4");
      }
      else if (uVar5 == 0x8034) {
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"A1B5G5R5");
      }
      else if (uVar5 == 0x8035) {
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"A8B8G8R8");
      }
      else if (uVar5 == 0x8036) {
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"A2B10G10R10");
      }
      else if (uVar5 == 0x8362) {
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"R3G3B2");
        *(undefined4 *)(in_RDI + 0x1c) = 0x78424752;
      }
      else if (uVar5 == 0x8363) {
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"B5G6R5");
        *(undefined4 *)(in_RDI + 0x1c) = 0x78424752;
      }
      else if (uVar5 == 0x8364) {
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"R5G6B5");
        *(undefined4 *)(in_RDI + 0x1c) = 0x78424752;
      }
      else if (uVar5 == 0x8365) {
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"R4G4B4A4");
      }
      else if (uVar5 == 0x8366) {
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"R5G5B5A1");
      }
      else if (uVar5 == 0x8367) {
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"R8G8B8A8");
      }
      else if (uVar5 == 0x8368) {
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"R10G10B10A2");
      }
      else {
        if (uVar5 != 0x8c3e) {
          set_last_error((mipmapped_texture *)in_stack_fffffffffffffd50,
                         (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          local_1 = 0;
          local_98 = 1;
          goto LAB_0016cc69;
        }
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"R9G9B9A5");
      }
      uVar5 = ktx_texture::get_ogl_type(&local_88);
      uVar3 = get_ogl_type_size(uVar5);
      pixel_packer::set_pixel_stride(&local_100,uVar3);
    }
    else {
      uVar5 = ktx_texture::get_ogl_fmt(&local_88);
      if (uVar5 == 1) goto LAB_0016c0d5;
      if (uVar5 == 2) goto LAB_0016c1e3;
      if (uVar5 == 3) goto LAB_0016c24f;
      if (uVar5 == 4) goto LAB_0016c2b8;
      if (uVar5 == 0x1903) goto LAB_0016c0d5;
      if (uVar5 == 0x1904) {
LAB_0016c10b:
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)0x24f063);
        *(undefined4 *)(in_RDI + 0x1c) = 0x78424752;
      }
      else if (uVar5 == 0x1905) {
LAB_0016c141:
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)0x24c91b);
        *(undefined4 *)(in_RDI + 0x1c) = 0x78424752;
      }
      else if (uVar5 == 0x1906) {
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)0x24aafd);
        *(undefined4 *)(in_RDI + 0x1c) = 0x41787878;
      }
      else if (uVar5 == 0x1907) {
LAB_0016c24f:
        pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"RGB");
        *(undefined4 *)(in_RDI + 0x1c) = 0x78424752;
      }
      else {
        if (uVar5 == 0x1908) goto LAB_0016c2b8;
        if (uVar5 == 0x1909) {
          pixel_packer::init(&local_100,(EVP_PKEY_CTX *)0x24ab0f);
          *(undefined4 *)(in_RDI + 0x1c) = 0x7878784c;
        }
        else if (uVar5 == 0x190a) {
          pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"YA");
          *(undefined4 *)(in_RDI + 0x1c) = 0x4178784c;
        }
        else {
          if (uVar5 == 0x8051) goto LAB_0016c24f;
          if (uVar5 == 0x8058) goto LAB_0016c2b8;
          if (uVar5 == 0x80e0) {
LAB_0016c285:
            pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"BGR");
            *(undefined4 *)(in_RDI + 0x1c) = 0x78424752;
          }
          else if (uVar5 == 0x80e1) {
LAB_0016c2dc:
            pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"BGRA");
          }
          else if (uVar5 - 0x8227 < 2) {
LAB_0016c1e3:
            pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"RG");
            *(undefined4 *)(in_RDI + 0x1c) = 0x4178784c;
          }
          else {
            if (uVar5 != 0x8229) {
              if (uVar5 == 0x822b) goto LAB_0016c1e3;
              if (uVar5 != 0x8232) {
                if (uVar5 - 0x8c40 < 2) goto LAB_0016c24f;
                if (1 < uVar5 - 0x8c42) {
                  if (uVar5 == 0x8d94) goto LAB_0016c0d5;
                  if (uVar5 == 0x8d95) goto LAB_0016c10b;
                  if (uVar5 == 0x8d96) goto LAB_0016c141;
                  if (uVar5 == 0x8d98) goto LAB_0016c24f;
                  if (uVar5 != 0x8d99) {
                    if (uVar5 == 0x8d9a) goto LAB_0016c285;
                    if (uVar5 != 0x8d9b) {
                      set_last_error((mipmapped_texture *)in_stack_fffffffffffffd50,
                                     (char *)CONCAT44(in_stack_fffffffffffffd4c,
                                                      in_stack_fffffffffffffd48));
                      local_1 = 0;
                      local_98 = 1;
                      goto LAB_0016cc69;
                    }
                    goto LAB_0016c2dc;
                  }
                }
LAB_0016c2b8:
                pixel_packer::init(&local_100,(EVP_PKEY_CTX *)"RGBA");
                goto LAB_0016c32e;
              }
            }
LAB_0016c0d5:
            pixel_packer::init(&local_100,(EVP_PKEY_CTX *)0x24cfbc);
            *(undefined4 *)(in_RDI + 0x1c) = 0x78424752;
          }
        }
      }
LAB_0016c32e:
      uVar3 = pixel_packer::get_num_comps(&local_100);
      uVar5 = ktx_texture::get_ogl_type(&local_88);
      uVar10 = get_ogl_type_size(uVar5);
      pixel_packer::set_pixel_stride(&local_100,uVar3 * uVar10);
    }
LAB_0016c393:
    cVar7 = pixel_format_helpers::get_component_flags(*(pixel_format *)(in_RDI + 0x1c));
    *(component_flags *)(in_RDI + 0x18) = cVar7;
    vector<crnlib::vector<crnlib::mip_level_*>_>::resize
              ((vector<crnlib::vector<crnlib::mip_level_*>_> *)in_stack_fffffffffffffd60,
               (uint)((ulong)in_stack_fffffffffffffd58 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffd58 >> 0x18,0));
    dynamic_string::dynamic_string((dynamic_string *)&stack0xfffffffffffffee0);
    bVar1 = ktx_texture::get_key_value_as_string
                      ((ktx_texture *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                       (char *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       (dynamic_string *)
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    if ((((bVar1) &&
         (uVar3 = dynamic_string::get_len((dynamic_string *)&stack0xfffffffffffffee0), 6 < uVar3))
        && ((cVar2 = dynamic_string::operator[]
                               ((dynamic_string *)in_stack_fffffffffffffd50,
                                in_stack_fffffffffffffd4c), cVar2 == 'S' &&
            ((cVar2 = dynamic_string::operator[]
                                ((dynamic_string *)in_stack_fffffffffffffd50,
                                 in_stack_fffffffffffffd4c), cVar2 == '=' &&
             (cVar2 = dynamic_string::operator[]
                                ((dynamic_string *)in_stack_fffffffffffffd50,
                                 in_stack_fffffffffffffd4c), cVar2 == ',')))))) &&
       ((cVar2 = dynamic_string::operator[]
                           ((dynamic_string *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c),
        cVar2 == 'T' &&
        (cVar2 = dynamic_string::operator[]
                           ((dynamic_string *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c),
        cVar2 == '=')))) {
      cVar2 = dynamic_string::operator[]
                        ((dynamic_string *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
      iVar9 = tolower((int)cVar2);
      if (iVar9 != 0x6c) {
        cVar2 = dynamic_string::operator[]
                          ((dynamic_string *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
        tolower((int)cVar2);
      }
      cVar2 = dynamic_string::operator[]
                        ((dynamic_string *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
      iVar9 = tolower((int)cVar2);
      if (iVar9 != 0x75) {
        cVar2 = dynamic_string::operator[]
                          ((dynamic_string *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
        tolower((int)cVar2);
      }
    }
    uVar4 = 0;
    for (local_12c = 0; local_12c < local_a0; local_12c = local_12c + 1) {
      vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20),local_12c);
      vector<crnlib::mip_level_*>::resize
                ((vector<crnlib::mip_level_*> *)in_stack_fffffffffffffd60,
                 (uint)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd58 >> 0x18,0));
      for (local_130 = 0; local_130 < local_9c; local_130 = local_130 + 1) {
        local_134 = math::maximum<unsigned_int>
                              (*(uint *)(in_RDI + 0x10) >> ((byte)local_130 & 0x1f),1);
        local_138 = math::maximum<unsigned_int>
                              (*(uint *)(in_RDI + 0x14) >> ((byte)local_130 & 0x1f),1);
        pmVar11 = crnlib_new<crnlib::mip_level>();
        local_140 = pmVar11;
        this_00 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                            ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20),
                             local_12c);
        ppmVar12 = vector<crnlib::mip_level_*>::operator[](this_00,local_130);
        *ppmVar12 = pmVar11;
        local_148 = ktx_texture::get_image_data
                              (in_stack_fffffffffffffd60,
                               (uint)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                               (uint)in_stack_fffffffffffffd58,
                               (uint)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                               (uint)in_stack_fffffffffffffd50);
        if ((local_bd & 1) == 0) {
          uVar3 = vector<unsigned_char>::size(local_148);
          iVar9 = local_134 * local_138;
          uVar10 = pixel_packer::get_pixel_stride(&local_100);
          if (uVar3 != iVar9 * uVar10) {
            local_1 = 0;
            goto LAB_0016cc5c;
          }
          in_stack_fffffffffffffd60 =
               (ktx_texture *)
               crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,unsigned_int,unsigned_int>
                         ((uint *)CONCAT44(uVar3,uVar10),
                          (uint *)CONCAT44(iVar9,in_stack_fffffffffffffd68));
          local_168 = in_stack_fffffffffffffd60;
          image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)in_stack_fffffffffffffd60,
                     *(component_flags *)(in_RDI + 0x18));
          in_stack_fffffffffffffd58 = (ktx_texture *)vector<unsigned_char>::get_ptr(local_148);
          local_170 = in_stack_fffffffffffffd58;
          color_quad<unsigned_char,_int>::color_quad
                    ((color_quad<unsigned_char,_int> *)in_stack_fffffffffffffd50,
                     in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48,0,0x16caea);
          for (local_178 = 0; local_178 < local_138; local_178 = local_178 + 1) {
            for (local_17c = 0; local_17c < local_134; local_17c = local_17c + 1) {
              color_quad<unsigned_char,_int>::color_quad(&local_180);
              in_stack_fffffffffffffd50 =
                   (ktx_texture *)
                   pixel_packer::unpack<crnlib::color_quad<unsigned_char,int>>
                             ((pixel_packer *)in_stack_fffffffffffffda0,
                              (void *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                              (color_quad<unsigned_char,_int> *)in_stack_fffffffffffffd90,
                              SUB81((ulong)in_stack_fffffffffffffd88 >> 0x38,0));
              local_170 = in_stack_fffffffffffffd50;
              image<crnlib::color_quad<unsigned_char,_int>_>::set_pixel_unclipped
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)in_stack_fffffffffffffd50
                         ,in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48,
                         (color_quad<unsigned_char,_int> *)0x16cb92);
            }
          }
          mip_level::assign((mip_level *)in_stack_fffffffffffffd60,
                            (image_u8 *)in_stack_fffffffffffffd58,
                            (pixel_format)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                            (orientation_flags_t)in_stack_fffffffffffffd50);
        }
        else {
          local_14c = pixel_format_helpers::get_dxt_bytes_per_block
                                (*(pixel_format *)(in_RDI + 0x1c));
          local_150 = local_134 + 3 >> 2;
          local_154 = local_138 + 3 >> 2;
          local_158 = local_150 * local_154 * local_14c;
          uVar3 = vector<unsigned_char>::size(local_148);
          if (uVar3 != local_158) {
            local_1 = 0;
            goto LAB_0016cc5c;
          }
          in_stack_fffffffffffffda0 = crnlib_new<crnlib::dxt_image>();
          local_160 = in_stack_fffffffffffffda0;
          uVar8 = dxt_image::init(in_stack_fffffffffffffda0,(EVP_PKEY_CTX *)(ulong)(uint)local_c4);
          in_stack_fffffffffffffd9f = (undefined1)uVar8;
          if ((uVar8 & 1) == 0) {
            crnlib_delete<crnlib::dxt_image>((dxt_image *)0x16c91f);
            local_1 = 0;
            goto LAB_0016cc5c;
          }
          in_stack_fffffffffffffd90 = dxt_image::get_element_vec(local_160);
          in_stack_fffffffffffffd88 =
               vector<crnlib::dxt_image::element>::operator[](in_stack_fffffffffffffd90,0);
          __src = vector<unsigned_char>::get_ptr(local_148);
          uVar3 = vector<unsigned_char>::size(local_148);
          memcpy(in_stack_fffffffffffffd88,__src,(ulong)uVar3);
          if ((*(int *)(in_RDI + 0x1c) == 0x31545844) && ((uVar4 & 0x1000000) == 0)) {
            bVar1 = dxt_image::has_alpha((dxt_image *)CONCAT44(uVar3,in_stack_fffffffffffffd78));
            in_stack_fffffffffffffd78 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd78);
            uVar4 = (uint)bVar1 << 0x18;
          }
          mip_level::assign((mip_level *)in_stack_fffffffffffffd60,
                            (dxt_image *)in_stack_fffffffffffffd58,
                            (pixel_format)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                            (orientation_flags_t)in_stack_fffffffffffffd50);
        }
      }
    }
    clear_last_error((mipmapped_texture *)0x16cc2c);
    if ((uVar4 & 0x1000000) != 0) {
      change_dxt1_to_dxt1a((mipmapped_texture *)in_stack_fffffffffffffd60);
    }
    local_1 = 1;
LAB_0016cc5c:
    local_98 = 1;
    dynamic_string::~dynamic_string((dynamic_string *)in_stack_fffffffffffffd50);
  }
  else {
    uVar5 = ktx_texture::get_ogl_internal_fmt(&local_88);
    if (uVar5 - 0x83a0 < 2) {
LAB_0016b901:
      local_c4 = cDXT1;
    }
    else if (uVar5 - 0x83a2 < 2) {
LAB_0016b91e:
      local_c4 = cDXT3;
    }
    else if (uVar5 - 0x83a4 < 2) {
LAB_0016b92b:
      local_c4 = cDXT5;
    }
    else {
      if (uVar5 == 0x83f0) goto LAB_0016b901;
      if (uVar5 == 0x83f1) {
LAB_0016b911:
        local_c4 = cDXT1A;
      }
      else {
        if (uVar5 == 0x83f2) goto LAB_0016b91e;
        if (uVar5 == 0x83f3) goto LAB_0016b92b;
        if (uVar5 == 0x8c4c) goto LAB_0016b901;
        if (uVar5 == 0x8c4d) goto LAB_0016b911;
        if (uVar5 == 0x8c4e) goto LAB_0016b91e;
        if (uVar5 == 0x8c4f) goto LAB_0016b92b;
        if (uVar5 == 0x8c70) {
          local_c4 = cDXT5A;
        }
        else if (uVar5 == 0x8d64) {
          local_c4 = cETC1;
        }
        else if (uVar5 == 0x8dbe) {
          local_c4 = cDXN_YX;
          if (local_a4 == 0x59583241) {
            local_c4 = cDXN_XY;
          }
        }
        else if (uVar5 == 0x9274) {
          local_c4 = cETC2;
        }
        else {
          if (uVar5 != 0x9278) {
            set_last_error((mipmapped_texture *)in_stack_fffffffffffffd50,
                           (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
            local_1 = 0;
            local_98 = 1;
            goto LAB_0016cc69;
          }
          local_c4 = cETC2A;
        }
      }
    }
    pVar6 = pixel_format_helpers::from_dxt_format(local_c4);
    *(pixel_format *)(in_RDI + 0x1c) = pVar6;
    if (*(int *)(in_RDI + 0x1c) != 0) {
      if (((local_a4 != 0) &&
          ((((local_a4 == 0x52424741 || (local_a4 == 0x52424778)) || (local_a4 == 0x52784778)) ||
           (local_a4 == 0x59784343)))) && (local_c4 == cDXT5)) {
        *(uint *)(in_RDI + 0x1c) = local_a4;
      }
      goto LAB_0016c393;
    }
    set_last_error((mipmapped_texture *)in_stack_fffffffffffffd50,
                   (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    local_1 = 0;
    local_98 = 1;
  }
LAB_0016cc69:
  dynamic_string::~dynamic_string((dynamic_string *)in_stack_fffffffffffffd50);
LAB_0016cc87:
  ktx_texture::~ktx_texture(in_stack_fffffffffffffd50);
  return (bool)(local_1 & 1);
}

Assistant:

bool mipmapped_texture::read_ktx(data_stream_serializer& serializer) {
  clear();

  set_last_error("Unable to read KTX file");

  ktx_texture kt;
  if (!kt.read_from_stream(serializer))
    return false;

  if ((kt.get_depth() > 1) || (kt.get_array_size() > 1)) {
    set_last_error("read_ktx: Depth and array textures are not supported");
    return false;
  }

  // Must be 1D, 2D, or a cubemap, with or without mipmaps.
  m_width = kt.get_width();
  m_height = kt.get_height();

  uint num_mip_levels = kt.get_num_mips();
  uint num_faces = kt.get_num_faces();

  uint32 crnlib_fourcc = 0;
  dynamic_string crnlib_fourcc_str;
  if (kt.get_key_value_as_string("CRNLIB_FOURCC", crnlib_fourcc_str)) {
    if (crnlib_fourcc_str.get_len() == 4) {
      for (int i = 3; i >= 0; i--)
        crnlib_fourcc = (crnlib_fourcc << 8) | crnlib_fourcc_str[i];
    }
  }

  const bool is_compressed_texture = kt.is_compressed();
  dxt_format dxt_fmt = cDXTInvalid;

  pixel_packer unpacker;
  if (is_compressed_texture) {
    switch (kt.get_ogl_internal_fmt()) {
      case KTX_ETC1_RGB8_OES:
        dxt_fmt = cETC1;
        break;
      case KTX_COMPRESSED_RGB8_ETC2:
        dxt_fmt = cETC2;
        break;
      case KTX_COMPRESSED_RGBA8_ETC2_EAC:
        dxt_fmt = cETC2A;
        break;
      case KTX_RGB_S3TC:
      case KTX_RGB4_S3TC:
      case KTX_COMPRESSED_RGB_S3TC_DXT1_EXT:
      case KTX_COMPRESSED_SRGB_S3TC_DXT1_EXT:
        dxt_fmt = cDXT1;
        break;
      case KTX_COMPRESSED_RGBA_S3TC_DXT1_EXT:
      case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT1_EXT:
        dxt_fmt = cDXT1A;
        break;
      case KTX_RGBA_S3TC:
      case KTX_RGBA4_S3TC:
      case KTX_COMPRESSED_RGBA_S3TC_DXT3_EXT:
      case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT3_EXT:
        dxt_fmt = cDXT3;
        break;
      case KTX_COMPRESSED_RGBA_S3TC_DXT5_EXT:
      case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT5_EXT:
      case KTX_RGBA_DXT5_S3TC:
      case KTX_RGBA4_DXT5_S3TC:
        dxt_fmt = cDXT5;
        break;
      case KTX_COMPRESSED_SIGNED_RED_GREEN_RGTC2_EXT:
        dxt_fmt = cDXN_YX;
        if (crnlib_fourcc == PIXEL_FMT_DXN) {
          dxt_fmt = cDXN_XY;
        }
        break;
      case KTX_COMPRESSED_LUMINANCE_LATC1_EXT:
        dxt_fmt = cDXT5A;
        break;
      default:
        set_last_error("Unsupported KTX internal format");
        return false;
    }

    m_format = pixel_format_helpers::from_dxt_format(dxt_fmt);
    if (m_format == PIXEL_FMT_INVALID) {
      set_last_error("Unsupported KTX internal compressed format");
      return false;
    }

    if (crnlib_fourcc != 0) {
      switch (crnlib_fourcc) {
        case PIXEL_FMT_DXT5_CCxY:
        case PIXEL_FMT_DXT5_xGxR:
        case PIXEL_FMT_DXT5_xGBR:
        case PIXEL_FMT_DXT5_AGBR: {
          if (dxt_fmt == cDXT5) {
            m_format = static_cast<pixel_format>(crnlib_fourcc);
          }
          break;
        }
      }
    }
  } else {
    m_format = PIXEL_FMT_A8R8G8B8;
    const uint type_size = get_ogl_type_size(kt.get_ogl_type());
    const uint type_bits = type_size * 8;

    // Normal component order:   1,2,3,4 (*last* component packed into LSB of output type)
    // Reversed component order: 4,3,2,1 (*first* component packed into LSB of output type)

    if (is_packed_pixel_ogl_type(kt.get_ogl_type())) {
      switch (kt.get_ogl_type()) {
        // 24bpp packed formats
        case KTX_UNSIGNED_BYTE_3_3_2:
          unpacker.init("B2G3R3");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        case KTX_UNSIGNED_BYTE_2_3_3_REV:
          unpacker.init("R3G3B2");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        case KTX_UNSIGNED_SHORT_5_6_5:
          unpacker.init("B5G6R5");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        case KTX_UNSIGNED_SHORT_5_6_5_REV:
          unpacker.init("R5G6B5");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        // 32bpp packed formats
        case KTX_UNSIGNED_SHORT_4_4_4_4:
          unpacker.init("A4B4G4R4");
          break;
        case KTX_UNSIGNED_SHORT_4_4_4_4_REV:
          unpacker.init("R4G4B4A4");
          break;
        case KTX_UNSIGNED_SHORT_5_5_5_1:
          unpacker.init("A1B5G5R5");
          break;
        case KTX_UNSIGNED_SHORT_1_5_5_5_REV:
          unpacker.init("R5G5B5A1");
          break;
        case KTX_UNSIGNED_INT_8_8_8_8:
          unpacker.init("A8B8G8R8");
          break;
        case KTX_UNSIGNED_INT_8_8_8_8_REV:
          unpacker.init("R8G8B8A8");
          break;
        case KTX_UNSIGNED_INT_10_10_10_2:
          unpacker.init("A2B10G10R10");
          break;
        case KTX_UNSIGNED_INT_2_10_10_10_REV:
          unpacker.init("R10G10B10A2");
          break;
        case KTX_UNSIGNED_INT_5_9_9_9_REV:
          unpacker.init("R9G9B9A5");
          break;
        default:
          set_last_error("Unsupported KTX packed pixel type");
          return false;
      }

      unpacker.set_pixel_stride(get_ogl_type_size(kt.get_ogl_type()));
    } else {
      switch (kt.get_ogl_fmt()) {
        case 1:
        case KTX_RED:
        case KTX_RED_INTEGER:
        case KTX_R8:
        case KTX_R8UI: {
          unpacker.init("R", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_GREEN:
        case KTX_GREEN_INTEGER: {
          unpacker.init("G", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_BLUE:
        case KTX_BLUE_INTEGER: {
          unpacker.init("B", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_ALPHA: {
          unpacker.init("A", -1, type_bits);
          m_format = PIXEL_FMT_A8;
          break;
        }
        case KTX_LUMINANCE: {
          unpacker.init("Y", -1, type_bits);
          m_format = PIXEL_FMT_L8;
          break;
        }
        case 2:
        case KTX_RG:
        case KTX_RG8:
        case KTX_RG_INTEGER: {
          unpacker.init("RG", -1, type_bits);
          m_format = PIXEL_FMT_A8L8;
          break;
        }
        case KTX_LUMINANCE_ALPHA: {
          unpacker.init("YA", -1, type_bits);
          m_format = PIXEL_FMT_A8L8;
          break;
        }
        case 3:
        case KTX_SRGB:
        case KTX_RGB:
        case KTX_RGB_INTEGER:
        case KTX_RGB8:
        case KTX_SRGB8: {
          unpacker.init("RGB", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_BGR:
        case KTX_BGR_INTEGER: {
          unpacker.init("BGR", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case 4:
        case KTX_RGBA_INTEGER:
        case KTX_RGBA:
        case KTX_SRGB_ALPHA:
        case KTX_SRGB8_ALPHA8:
        case KTX_RGBA8: {
          unpacker.init("RGBA", -1, type_bits);
          break;
        }
        case KTX_BGRA:
        case KTX_BGRA_INTEGER: {
          unpacker.init("BGRA", -1, type_bits);
          break;
        }
        default:
          set_last_error("Unsupported KTX pixel format");
          return false;
      }

      unpacker.set_pixel_stride(unpacker.get_num_comps() * get_ogl_type_size(kt.get_ogl_type()));
    }

    CRNLIB_ASSERT(unpacker.is_valid());
  }

  m_comp_flags = pixel_format_helpers::get_component_flags(m_format);

  m_faces.resize(num_faces);

  bool x_flipped = false;
  bool y_flipped = true;

  dynamic_string orient;
  if ((kt.get_key_value_as_string("KTXorientation", orient)) && (orient.get_len() >= 7)) {
    //  0123456
    // "S=r,T=d"
    if ((orient[0] == 'S') && (orient[1] == '=') && (orient[3] == ',') &&
        (orient[4] == 'T') && (orient[5] == '=')) {
      if (tolower(orient[2]) == 'l')
        x_flipped = true;
      else if (tolower(orient[2]) == 'r')
        x_flipped = false;

      if (tolower(orient[6]) == 'u')
        y_flipped = true;
      else if (tolower(orient[6]) == 'd')
        y_flipped = false;
    }
  }

  orientation_flags_t orient_flags = cDefaultOrientationFlags;
  if (x_flipped)
    orient_flags = static_cast<orientation_flags_t>(orient_flags | cOrientationFlagXFlipped);
  if (y_flipped)
    orient_flags = static_cast<orientation_flags_t>(orient_flags | cOrientationFlagYFlipped);

  bool dxt1_alpha = false;

  for (uint face_index = 0; face_index < num_faces; face_index++) {
    m_faces[face_index].resize(num_mip_levels);

    for (uint level_index = 0; level_index < num_mip_levels; level_index++) {
      const uint width = math::maximum<uint>(m_width >> level_index, 1U);
      const uint height = math::maximum<uint>(m_height >> level_index, 1U);

      mip_level* pMip = crnlib_new<mip_level>();
      m_faces[face_index][level_index] = pMip;

      const crnlib::vector<uint8>& image_data = kt.get_image_data(level_index, 0, face_index, 0);

      if (is_compressed_texture) {
        const uint bytes_per_block = pixel_format_helpers::get_dxt_bytes_per_block(m_format);

        const uint num_blocks_x = (width + 3) >> 2;
        const uint num_blocks_y = (height + 3) >> 2;

        const uint level_pitch = num_blocks_x * num_blocks_y * bytes_per_block;
        if (image_data.size() != level_pitch)
          return false;

        dxt_image* pDXTImage = crnlib_new<dxt_image>();
        if (!pDXTImage->init(dxt_fmt, width, height, false)) {
          crnlib_delete(pDXTImage);

          CRNLIB_ASSERT(0);
          return false;
        }

        CRNLIB_ASSERT(pDXTImage->get_element_vec().size() * sizeof(dxt_image::element) == level_pitch);

        memcpy(&pDXTImage->get_element_vec()[0], image_data.get_ptr(), image_data.size());

        if ((m_format == PIXEL_FMT_DXT1) && (!dxt1_alpha))
          dxt1_alpha = pDXTImage->has_alpha();

        pMip->assign(pDXTImage, m_format, orient_flags);
      } else {
        if (image_data.size() != (width * height * unpacker.get_pixel_stride()))
          return false;

        image_u8* pImage = crnlib_new<image_u8>(width, height);

        pImage->set_comp_flags(m_comp_flags);

        const uint8* pSrc = image_data.get_ptr();

        color_quad_u8 q(0, 0, 0, 255);

        for (uint y = 0; y < height; y++) {
          for (uint x = 0; x < width; x++) {
            color_quad_u8 c;
            pSrc = static_cast<const uint8*>(unpacker.unpack(pSrc, c));
            pImage->set_pixel_unclipped(x, y, c);
          }
        }

        pMip->assign(pImage, m_format, orient_flags);

        CRNLIB_ASSERT(pMip->get_comp_flags() == m_comp_flags);
      }
    }
  }

  clear_last_error();

  if (dxt1_alpha)
    change_dxt1_to_dxt1a();

  return true;
}